

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_> parseProject(Output *output,char *file)

{
  char *in_RDX;
  allocator local_2c1;
  uint line;
  undefined4 uStack_2bc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
  regexCache;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string pathBase;
  ifstream in;
  byte abStack_210 [488];
  
  std::ifstream::ifstream(&in,in_RDX,_S_in);
  if ((abStack_210[*(long *)(_in + -0x18)] & 5) == 0) {
    getCurrentDirectory_abi_cxx11_();
    std::__cxx11::string::string((string *)&local_270,in_RDX,&local_2c1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                   &local_270,"/..");
    normalizePath_abi_cxx11_
              (&pathBase,(char *)regexCache._M_t._M_impl._0_8_,(char *)CONCAT44(uStack_2bc,line));
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&regexCache);
    line = 0;
    regexCache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &regexCache._M_t._M_impl.super__Rb_tree_header._M_header;
    regexCache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    regexCache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    regexCache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    regexCache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         regexCache._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    parseGroup((ifstream *)output,(char *)&in,&line,(ProjectGroup *)0x0,&regexCache,
               pathBase._M_dataplus._M_p);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
    ::~_Rb_tree(&regexCache._M_t);
    std::__cxx11::string::~string((string *)&pathBase);
  }
  else {
    (**(code **)(*(long *)file + 0x20))(file,"Error reading file %s\n");
    output->_vptr_Output = (_func_int **)0x0;
  }
  std::ifstream::~ifstream(&in);
  return (__uniq_ptr_data<ProjectGroup,_std::default_delete<ProjectGroup>,_true,_true>)
         (__uniq_ptr_data<ProjectGroup,_std::default_delete<ProjectGroup>,_true,_true>)output;
}

Assistant:

std::unique_ptr<ProjectGroup> parseProject(Output* output, const char* file)
{
	std::ifstream in(file);
	if (!in)
	{
		output->error("Error reading file %s\n", file);
		return std::unique_ptr<ProjectGroup>();
	}

	// treat all project paths as project file-relative; treat project file path as current directory-relative
	std::string pathBase = normalizePath(getCurrentDirectory().c_str(), (std::string(file) + "/..").c_str());

	unsigned int line = 0;
	std::map<std::string, std::shared_ptr<Regex>> regexCache;

	try
	{
		return parseGroup(in, file, line, 0, regexCache, pathBase.c_str());
	}
	catch (const std::exception& e)
	{
		output->error("%s(%d): %s\n", file, line, e.what());
		return std::unique_ptr<ProjectGroup>();
	}
}